

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O3

void S_LoadSound3D(sfxinfo_t *sfx)

{
  uint uVar1;
  int iVar2;
  uint length;
  BYTE *sfxdata;
  undefined4 extraout_var;
  SoundHandle SVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ushort uVar4;
  pair<SoundHandle,_bool> pVar5;
  FWadLump wlump;
  
  iVar2 = (*GSnd->_vptr_SoundRenderer[2])();
  if (((char)iVar2 == '\0') && ((sfx->data3d).data == (void *)0x0)) {
    DPrintf(3,"Loading monoized sound \"%s\" (%td)\n",(sfx->name).Chars,
            ((long)sfx - (long)S_sfx.Array >> 4) * -0x3333333333333333);
    length = FWadCollection::LumpLength(&Wads,sfx->lumpnum);
    if (0 < (int)length) {
      FWadCollection::OpenLumpNum(&wlump,&Wads,sfx->lumpnum);
      sfxdata = (BYTE *)operator_new__((ulong)length);
      FWadLump::Read(&wlump,sfxdata,(ulong)length);
      uVar1 = *(uint *)(sfxdata + 4);
      iVar2 = strncmp((char *)sfxdata,"Creative Voice File",0x13);
      if (iVar2 == 0) {
        pVar5 = SoundRenderer::LoadSoundVoc(GSnd,sfxdata,length,true);
        SVar3 = pVar5.first.data;
      }
      else if ((sfx->field_0x30 & 4) == 0) {
        if ((*sfxdata == '\x03') && ((int)uVar1 <= (int)(length - 8) && sfxdata[1] == '\0')) {
          uVar4 = 0x2b11;
          if (*(ushort *)(sfxdata + 2) != 0) {
            uVar4 = *(ushort *)(sfxdata + 2);
          }
          iVar2 = (*GSnd->_vptr_SoundRenderer[6])
                            (GSnd,sfxdata + 8,(ulong)uVar1,(ulong)uVar4,1,8,
                             (ulong)(uint)sfx->LoopStart,0xffffffffffffffff,1);
          SVar3.data = (void *)CONCAT44(extraout_var_01,iVar2);
        }
        else {
          iVar2 = (*GSnd->_vptr_SoundRenderer[5])(GSnd,sfxdata,(ulong)length,1);
          SVar3.data = (void *)CONCAT44(extraout_var,iVar2);
        }
      }
      else {
        iVar2 = (*GSnd->_vptr_SoundRenderer[6])
                          (GSnd,sfxdata,(ulong)length,(ulong)sfx->RawRate,1,8,
                           (ulong)(uint)sfx->LoopStart,1,0);
        SVar3.data = (void *)CONCAT44(extraout_var_00,iVar2);
      }
      operator_delete__(sfxdata);
      (sfx->data3d).data = SVar3.data;
      FWadLump::~FWadLump(&wlump);
    }
  }
  return;
}

Assistant:

static void S_LoadSound3D(sfxinfo_t *sfx)
{
    if (GSnd->IsNull()) return;

    if(sfx->data3d.isValid())
        return;

    DPrintf(DMSG_NOTIFY, "Loading monoized sound \"%s\" (%td)\n", sfx->name.GetChars(), sfx - &S_sfx[0]);

    int size = Wads.LumpLength(sfx->lumpnum);
    if(size <= 0) return;

    FWadLump wlump = Wads.OpenLumpNum(sfx->lumpnum);
    BYTE *sfxdata = new BYTE[size];
    wlump.Read(sfxdata, size);
    SDWORD dmxlen = LittleLong(((SDWORD *)sfxdata)[1]);
    std::pair<SoundHandle,bool> snd;

    // If the sound is voc, use the custom loader.
    if (strncmp ((const char *)sfxdata, "Creative Voice File", 19) == 0)
    {
        snd = GSnd->LoadSoundVoc(sfxdata, size, true);
    }
    // If the sound is raw, just load it as such.
    else if (sfx->bLoadRAW)
    {
        snd = GSnd->LoadSoundRaw(sfxdata, size, sfx->RawRate, 1, 8, sfx->LoopStart, true);
    }
    // Otherwise, try the sound as DMX format.
    else if (((BYTE *)sfxdata)[0] == 3 && ((BYTE *)sfxdata)[1] == 0 && dmxlen <= size - 8)
    {
        int frequency = LittleShort(((WORD *)sfxdata)[1]);
        if (frequency == 0) frequency = 11025;
        snd = GSnd->LoadSoundRaw(sfxdata+8, dmxlen, frequency, 1, 8, sfx->LoopStart, -1, true);
    }
    // If that fails, let the sound system try and figure it out.
    else
    {
        snd = GSnd->LoadSound(sfxdata, size, true);
    }
    delete[] sfxdata;

    sfx->data3d = snd.first;
}